

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::save(ANN *this,string *filepath)

{
  uint uVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  Matrix *pMVar5;
  uint local_234;
  uint local_230;
  uint i_1;
  uint i;
  ostream local_220 [8];
  ofstream file;
  uint n_weights;
  uint n_perceptron;
  string *filepath_local;
  ANN *this_local;
  
  std::ofstream::ofstream(local_220,filepath,0x10);
  sVar2 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
  poVar3 = (ostream *)std::ostream::operator<<(local_220,sVar2);
  std::operator<<(poVar3,'\n');
  local_230 = 0;
  while( true ) {
    sVar2 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
    if (sVar2 <= local_230) break;
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)local_230);
    uVar1 = Layer::get_nb_perceptrons(pvVar4);
    poVar3 = (ostream *)std::ostream::operator<<(local_220,uVar1);
    std::operator<<(poVar3,", ");
    local_230 = local_230 + 1;
  }
  local_234 = 0;
  while( true ) {
    sVar2 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
    if (sVar2 - 1 <= (ulong)local_234) break;
    std::operator<<(local_220,'\n');
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)local_234);
    pMVar5 = Layer::weights(pvVar4);
    Matrix::print_weights(pMVar5,local_220);
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)local_234);
    pMVar5 = Layer::biases(pvVar4);
    Matrix::print_weights(pMVar5,local_220);
    local_234 = local_234 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void ANN::save(const std::string& filepath) const{
    uint n_perceptron=0, n_weights=0;
    std::ofstream file(filepath);

    file<<m_layers.size()<<'\n';
    for(uint i=0;i<m_layers.size();++i){
        file<<m_layers[i].get_nb_perceptrons()<<", ";
    }
    for(uint i=0;i<m_layers.size()-1;++i){
        file<<'\n';
        m_layers[i].weights().print_weights(file);
        m_layers[i].biases().print_weights(file);
    }

    file.close();
}